

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::timestamp_t,duckdb::DatePart::MillenniumOperator,long>
          (DatePart *this,vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  char cVar1;
  bool bVar2;
  date_t dVar3;
  int iVar4;
  reference stats;
  timestamp_t tVar5;
  timestamp_t tVar6;
  long lVar7;
  long lVar8;
  BaseStatistics result;
  Value local_e0 [64];
  LogicalType local_a0 [24];
  BaseStatistics local_88 [88];
  
  stats = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  cVar1 = duckdb::NumericStats::HasMinMax(stats);
  if (cVar1 != '\0') {
    tVar5 = NumericStats::GetMin<duckdb::timestamp_t>(stats);
    tVar6 = NumericStats::GetMax<duckdb::timestamp_t>(stats);
    if (((tVar5.value <= tVar6.value) &&
        (bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar5), bVar2)) &&
       (bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar6), bVar2)) {
      dVar3.days = duckdb::Timestamp::GetDate(tVar5);
      iVar4 = duckdb::Date::ExtractYear(dVar3);
      if (iVar4 < 1) {
        lVar7 = (long)iVar4 / 1000 + -1;
      }
      else {
        lVar7 = ((long)iVar4 - 1U) / 1000 + 1;
      }
      dVar3.days = duckdb::Timestamp::GetDate(tVar6);
      iVar4 = duckdb::Date::ExtractYear(dVar3);
      if (iVar4 < 1) {
        lVar8 = (long)iVar4 / 1000 + -1;
      }
      else {
        lVar8 = ((long)iVar4 - 1U) / 1000 + 1;
      }
      duckdb::LogicalType::LogicalType(local_a0,stats_type);
      duckdb::NumericStats::CreateEmpty(local_88,local_a0);
      duckdb::LogicalType::~LogicalType(local_a0);
      duckdb::Value::Value(local_e0,lVar7);
      duckdb::NumericStats::SetMin(local_88,local_e0);
      duckdb::Value::~Value(local_e0);
      duckdb::Value::Value(local_e0,lVar8);
      duckdb::NumericStats::SetMax(local_88,local_e0);
      duckdb::Value::~Value(local_e0);
      vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
      duckdb::BaseStatistics::CopyValidity(local_88);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(local_88);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}